

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# probe.c
# Opt level: O0

int countSkin(atom *src,atom *scratch,pointSet *dots)

{
  bool bVar1;
  int iVar2;
  point3d *ppVar3;
  int local_7c;
  pointSet *ppStack_78;
  int dotCnt;
  pointSet *srcDots;
  point3d dotvect;
  point3d dotloc;
  int ok;
  int within;
  int i;
  atom *targ;
  pointSet *dots_local;
  atom *scratch_local;
  atom *src_local;
  
  local_7c = 0;
  if ((src->elem == 1) || (src->elem == 5)) {
    src_local._4_4_ = 0;
  }
  else {
    ppStack_78 = dots + src->elem;
    if ((src->elem == 6) && (iVar2 = isCarbonylAtom(src), iVar2 != 0)) {
      ppStack_78 = &COdots;
    }
    for (ok = 0; ok < ppStack_78->n; ok = ok + 1) {
      ppVar3 = ppStack_78->p + ok;
      srcDots = (pointSet *)ppVar3->x;
      dotvect.x = ppVar3->y;
      dotvect.y = ppVar3->z;
      v3add((vector3d *)&src->loc,(vector3d *)&srcDots,(vector3d *)&dotvect.z);
      bVar1 = true;
      for (_within = scratch; _within != (atom *)0x0; _within = _within->scratch) {
        if ((((_within->elem != 1) && (_within->mark != 0)) && (_within->elem != 5)) &&
           ((dotloc.y - (_within->loc).z) * (dotloc.y - (_within->loc).z) +
            (dotvect.z - (_within->loc).x) * (dotvect.z - (_within->loc).x) +
            (dotloc.x - (_within->loc).y) * (dotloc.x - (_within->loc).y) <=
            (double)(_within->radius * _within->radius))) {
          bVar1 = false;
          break;
        }
      }
      if (bVar1) {
        local_7c = local_7c + 1;
      }
    }
    src_local._4_4_ = local_7c;
  }
  return src_local._4_4_;
}

Assistant:

int countSkin(atom *src, atom *scratch, pointSet dots[])
{
   atom *targ = NULL;
   int i = 0, within = 0, ok = 0;
   point3d dotloc, dotvect;
   pointSet *srcDots;
   int dotCnt = 0;

   if (src->elem == ignoreAtom
    || src->elem == atomHOd)   { return 0; } /*hb-only-dummy, phantom H atom*/

   srcDots = &(dots[src->elem]);
   if (src->elem == atomC && isCarbonylAtom(src)) {
      srcDots = &COdots;
   }

   for(i=0; i < srcDots->n; i++) {
      dotvect = srcDots->p[i];

      v3add(&(src->loc), &dotvect, &dotloc);

      ok = TRUE;

      /*targ is an atom*, scratch is an atom*,  atom* defined in abin.h */
      /* atom* scratch is a member of atom*: which has member scratch...*/
      /* so for-loop moves through all these atoms while an atom has a scratch*/

      for(targ = scratch; targ; targ = targ->scratch) {
	 if (targ->elem == ignoreAtom) {continue;}

	 /* eliminate if within bonded atom! */
	 if (targ->mark && (targ->elem != atomHOd)) {
#ifdef INLINE_FOR_SPEED
	    within = INRANGEINLINE(dotloc, (targ->loc), targ->radius);
#else
	    within = inRange(&dotloc, &(targ->loc), targ->radius);
#endif

	    if (within) { ok = FALSE; break; }
	 }
      }
      if (ok) { dotCnt++; }
   }
   return dotCnt;
}